

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

int QObject::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  MethodType MVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int *piVar8;
  QMetaObject *pQVar9;
  undefined4 extraout_var;
  undefined8 *in_RCX;
  undefined4 in_register_00000014;
  undefined4 in_register_0000003c;
  Connection *this;
  int in_R9D;
  long in_FS_OFFSET;
  int *types;
  QMetaObject *rmeta;
  QMetaObject *smeta;
  Connection *handle;
  int dummy;
  int method_index;
  int signal_index;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffd30;
  QMetaMethod *in_stack_fffffffffffffd38;
  QMessageLogger *in_stack_fffffffffffffd40;
  QMetaMethod *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  uint uVar10;
  QMetaMethod *in_stack_fffffffffffffda0;
  char *local_238;
  char *local_210;
  QMessageLogger local_168 [3];
  QMessageLogger local_100;
  QMessageLogger local_c8;
  undefined4 local_a4;
  int local_a0;
  uint local_9c;
  QMessageLogger local_68;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  this = (Connection *)CONCAT44(in_register_0000003c,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((__addr == (sockaddr *)0x0) || (in_RCX == (undefined8 *)0x0)) ||
      (MVar2 = QMetaMethod::methodType
                         ((QMetaMethod *)
                          CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)),
      MVar2 != Signal)) ||
     (MVar2 = QMetaMethod::methodType
                        ((QMetaMethod *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)),
     MVar2 == Constructor)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffd30,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f2bf3);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                 (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 (char *)0x3f2c0c);
      if (__addr == (sockaddr *)0x0) {
        local_210 = "(nullptr)";
      }
      else {
        (*(code *)**(undefined8 **)__addr)();
        local_210 = QMetaObject::className
                              ((QMetaObject *)
                               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
      QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
      pcVar4 = QByteArray::constData((QByteArray *)0x3f2c79);
      if (in_RCX == (undefined8 *)0x0) {
        local_238 = "(nullptr)";
      }
      else {
        (**(code **)*in_RCX)();
        local_238 = QMetaObject::className
                              ((QMetaObject *)
                               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
      QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
      pcVar5 = QByteArray::constData((QByteArray *)0x3f2d14);
      QMessageLogger::warning
                (&local_68,"QObject::connect: Cannot connect %s::%s to %s::%s",local_210,pcVar4,
                 local_238,pcVar5);
      QByteArray::~QByteArray((QByteArray *)0x3f2d54);
      QByteArray::~QByteArray((QByteArray *)0x3f2d61);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    QMetaObject::Connection::Connection(this,(void *)0x0);
  }
  else {
    local_9c = 0xaaaaaaaa;
    local_a0 = -0x55555556;
    local_a4 = 0xaaaaaaaa;
    QMetaObjectPrivate::memberIndexes
              ((QObject *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40,
               (int *)in_stack_fffffffffffffd38);
    QMetaObjectPrivate::memberIndexes
              ((QObject *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40,
               (int *)in_stack_fffffffffffffd38);
    (*(code *)**(undefined8 **)__addr)();
    (**(code **)*in_RCX)();
    if (local_9c == 0xffffffff) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcConnect();
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffd30,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f2ece);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (char *)0x3f2ee5);
        QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
        pcVar4 = QByteArray::constData((QByteArray *)0x3f2f0f);
        pcVar5 = QMetaObject::className
                           ((QMetaObject *)
                            CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        QMessageLogger::warning
                  (&local_c8,"QObject::connect: Can\'t find signal %s on instance of class %s",
                   pcVar4,pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x3f2f63);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      QMetaObject::Connection::Connection(this,(void *)0x0);
    }
    else if (local_a0 == -1) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      lcConnect();
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffd30,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f3014);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (char *)0x3f302b);
        QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
        pcVar4 = QByteArray::constData((QByteArray *)0x3f304f);
        pcVar5 = QMetaObject::className
                           ((QMetaObject *)
                            CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        QMessageLogger::warning
                  (&local_100,"QObject::connect: Can\'t find method %s on instance of class %s",
                   pcVar4,pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x3f3097);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      QMetaObject::Connection::Connection(this,(void *)0x0);
    }
    else {
      QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
      QByteArray::constData((QByteArray *)0x3f3108);
      QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
      QByteArray::constData((QByteArray *)0x3f3131);
      bVar1 = QMetaObject::checkConnectArgs
                        ((char *)in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
      QByteArray::~QByteArray((QByteArray *)0x3f315b);
      QByteArray::~QByteArray((QByteArray *)0x3f3168);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if ((in_R9D == 2) &&
           (piVar8 = queuedConnectionTypes(in_stack_fffffffffffffda0), piVar8 == (int *)0x0)) {
          QMetaObject::Connection::Connection(this,(void *)0x0);
        }
        else {
          this->d_ptr = &DAT_aaaaaaaaaaaaaaaa;
          uVar10 = local_9c;
          pQVar9 = QMetaMethod::enclosingMetaObject
                             ((QMetaMethod *)CONCAT44(in_register_00000014,__len));
          iVar3 = QMetaObjectPrivate::connect
                            ((int)__addr,(sockaddr *)(ulong)uVar10,(socklen_t)pQVar9);
          QMetaObject::Connection::Connection(this,(void *)CONCAT44(extraout_var,iVar3));
        }
      }
      else {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        lcConnect();
        anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  (in_stack_fffffffffffffd30,
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
          anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f31cb);
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (char *)0x3f31e2);
          pcVar4 = QMetaObject::className
                             ((QMetaObject *)
                              CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
          pcVar5 = QByteArray::constData((QByteArray *)0x3f3218);
          pcVar6 = QMetaObject::className
                             ((QMetaObject *)
                              CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          QMetaMethod::methodSignature(in_stack_fffffffffffffd38);
          pcVar7 = QByteArray::constData((QByteArray *)0x3f3255);
          QMessageLogger::warning
                    (local_168,
                     "QObject::connect: Incompatible sender/receiver arguments\n        %s::%s --> %s::%s"
                     ,pcVar4,pcVar5,pcVar6,pcVar7);
          QByteArray::~QByteArray((QByteArray *)0x3f328c);
          QByteArray::~QByteArray((QByteArray *)0x3f3299);
          local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
        }
        QMetaObject::Connection::Connection(this,(void *)0x0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return __fd;
}

Assistant:

QMetaObject::Connection QObject::connect(const QObject *sender, const QMetaMethod &signal,
                                     const QObject *receiver, const QMetaMethod &method,
                                     Qt::ConnectionType type)
{
    if (sender == nullptr
            || receiver == nullptr
            || signal.methodType() != QMetaMethod::Signal
            || method.methodType() == QMetaMethod::Constructor) {
        qCWarning(lcConnect, "QObject::connect: Cannot connect %s::%s to %s::%s",
                  sender ? sender->metaObject()->className() : "(nullptr)",
                  signal.methodSignature().constData(),
                  receiver ? receiver->metaObject()->className() : "(nullptr)",
                  method.methodSignature().constData());
        return QMetaObject::Connection(nullptr);
    }

    int signal_index;
    int method_index;
    {
        int dummy;
        QMetaObjectPrivate::memberIndexes(sender, signal, &signal_index, &dummy);
        QMetaObjectPrivate::memberIndexes(receiver, method, &dummy, &method_index);
    }

    const QMetaObject *smeta = sender->metaObject();
    const QMetaObject *rmeta = receiver->metaObject();
    if (signal_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find signal %s on instance of class %s",
                  signal.methodSignature().constData(), smeta->className());
        return QMetaObject::Connection(nullptr);
    }
    if (method_index == -1) {
        qCWarning(lcConnect, "QObject::connect: Can't find method %s on instance of class %s",
                  method.methodSignature().constData(), rmeta->className());
        return QMetaObject::Connection(nullptr);
    }

    if (!QMetaObject::checkConnectArgs(signal.methodSignature().constData(),
                                       method.methodSignature().constData())) {
        qCWarning(lcConnect,
                  "QObject::connect: Incompatible sender/receiver arguments"
                  "\n        %s::%s --> %s::%s",
                  smeta->className(), signal.methodSignature().constData(), rmeta->className(),
                  method.methodSignature().constData());
        return QMetaObject::Connection(nullptr);
    }

    int *types = nullptr;
    if ((type == Qt::QueuedConnection) && !(types = queuedConnectionTypes(signal)))
        return QMetaObject::Connection(nullptr);

#ifndef QT_NO_DEBUG
    check_and_warn_compat(smeta, signal, rmeta, method);
#endif
    QMetaObject::Connection handle = QMetaObject::Connection(QMetaObjectPrivate::connect(
        sender, signal_index, signal.enclosingMetaObject(), receiver, method_index, nullptr, type, types));
    return handle;
}